

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O2

void __thiscall chrono::ChTimestepperHeun::Advance(ChTimestepperHeun *this,double dt)

{
  ChState *y;
  ChState *this_00;
  ChVectorDynamic<> *this_01;
  ChStateDelta *pCVar1;
  ChStateDelta *expr;
  ChIntegrable *pCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ChStateDelta local_a8;
  ChStateDelta *local_90;
  ChStateDelta local_88;
  ChStateDelta local_70;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_58;
  
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  y = &(this->super_ChTimestepperIorder).Y;
  local_90 = &(this->super_ChTimestepperIorder).dYdt;
  (*pCVar2->_vptr_ChIntegrable[3])(pCVar2,y);
  iVar3 = (**((this->super_ChTimestepperIorder).super_ChTimestepper.integrable)->_vptr_ChIntegrable)
                    ();
  iVar4 = (*((this->super_ChTimestepperIorder).super_ChTimestepper.integrable)->_vptr_ChIntegrable
            [1])();
  iVar5 = (*((this->super_ChTimestepperIorder).super_ChTimestepper.integrable)->_vptr_ChIntegrable
            [2])();
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  this_00 = &this->y_new;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(long)iVar3);
  (this->y_new).integrable = pCVar2;
  pCVar1 = &this->Dydt1;
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pCVar1,(long)iVar4);
  (this->Dydt1).integrable = pCVar2;
  expr = &this->Dydt2;
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)expr,(long)iVar4);
  this_01 = &(this->super_ChTimestepperIorder).super_ChTimestepper.L;
  (this->Dydt2).integrable = pCVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar5);
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  (*pCVar2->_vptr_ChIntegrable[4])
            (pCVar2,y,&(this->super_ChTimestepperIorder).super_ChTimestepper.T);
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  (*pCVar2->_vptr_ChIntegrable[10])
            ((this->super_ChTimestepperIorder).super_ChTimestepper.T,dt,pCVar2,pCVar1,this_01,y,0,0)
  ;
  ChStateDelta::operator*(&local_a8,pCVar1,dt);
  chrono::operator+((ChState *)&local_58,y,&local_a8);
  ChState::operator=(this_00,(ChState *)&local_58);
  Eigen::internal::handmade_aligned_free
            (local_58.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_data);
  Eigen::internal::handmade_aligned_free
            (local_a8.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  (*pCVar2->_vptr_ChIntegrable[10])
            (dt + (this->super_ChTimestepperIorder).super_ChTimestepper.T,pCVar2,expr,this_01,
             this_00,1,1);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_58,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)expr,(type *)0x0);
  ChStateDelta::operator+(&local_88,pCVar1,&local_58);
  ChStateDelta::operator*(&local_70,&local_88,dt * 0.5);
  chrono::operator+((ChState *)&local_a8,y,&local_70);
  ChState::operator=(y,(ChState *)&local_a8);
  Eigen::internal::handmade_aligned_free
            (local_a8.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_70.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_88.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
  pCVar1 = local_90;
  ChStateDelta::operator=(local_90,expr);
  (this->super_ChTimestepperIorder).super_ChTimestepper.T =
       dt + (this->super_ChTimestepperIorder).super_ChTimestepper.T;
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  (*pCVar2->_vptr_ChIntegrable[5])(pCVar2,y,1);
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  (*pCVar2->_vptr_ChIntegrable[7])(pCVar2,pCVar1);
  pCVar2 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  (*pCVar2->_vptr_ChIntegrable[9])(pCVar2,this_01);
  return;
}

Assistant:

void ChTimestepperHeun::Advance(const double dt) {
    // setup main vectors
    GetIntegrable()->StateSetup(Y, dYdt);

    // setup auxiliary vectors
    int n_y = GetIntegrable()->GetNcoords_y();
    int n_dy = GetIntegrable()->GetNcoords_dy();
    int n_c = GetIntegrable()->GetNconstr();
    y_new.setZero(n_y, GetIntegrable());
    Dydt1.setZero(n_dy, GetIntegrable());
    Dydt2.setZero(n_dy, GetIntegrable());
    L.setZero(n_c);

    GetIntegrable()->StateGather(Y, T);  // state <- system

    GetIntegrable()->StateSolve(Dydt1, L, Y, T, dt,
                                false,  // no need to scatter state before computation
                                false   // full update? ( not used, since no scatter)
    );
    y_new = Y + Dydt1 * dt;
    GetIntegrable()->StateSolve(Dydt2, L, y_new, T + dt, dt, true, true);

    Y = Y + (Dydt1 + Dydt2) * (dt / 2.);
    dYdt = Dydt2;
    T += dt;

    GetIntegrable()->StateScatter(Y, T, true);            // state -> system
    GetIntegrable()->StateScatterDerivative(dYdt);  // -> system auxiliary data
    GetIntegrable()->StateScatterReactions(L);      // -> system auxiliary data
}